

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  EntryVector *this_00;
  int iVar1;
  BFSEntry *pBVar2;
  SharedDepEntry *dep;
  pointer piVar3;
  pointer pLVar4;
  cmGeneratorTarget *this_01;
  BFSEntry qe;
  FILE *__stream;
  undefined8 __p;
  bool bVar5;
  __type _Var6;
  TargetType TVar7;
  iterator iVar8;
  iterator __rhs;
  _Base_ptr p_Var9;
  string *psVar10;
  char *pcVar11;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __tmp_1;
  long lVar12;
  _Base_ptr p_Var13;
  value_type *__x;
  pointer piVar14;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __tmp;
  long lVar15;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar16;
  int i;
  LinkEntry *local_70;
  _Rb_tree_node_base *local_68;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  
  AddDirectLinkEntries(this);
  while (pBVar2 = (this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->BFSQueue).c.
        super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar2) {
    qe = *pBVar2;
    std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
    pop_front(&(this->BFSQueue).c);
    FollowLinkEntry(this,qe);
  }
  while (dep = (this->SharedDepQueue).c.
               super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    HandleSharedDependency(this,dep);
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::pop_front(&(this->SharedDepQueue).c);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    fwrite("------------------------------------------------------------------------------\n",0x4f,1
           ,_stderr);
    __stream = _stderr;
    psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    if (this->HasConfig == false) {
      pcVar11 = "noconfig";
    }
    else {
      pcVar11 = (this->Config)._M_dataplus._M_p;
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",
            (psVar10->_M_dataplus)._M_p,pcVar11);
    DisplayConstraintGraph(this);
  }
  std::make_unique<cmComputeComponentGraph,cmGraphAdjacencyList&>((cmGraphAdjacencyList *)&emitted);
  __p = emitted._M_t._M_impl._0_8_;
  emitted._M_t._M_impl._0_8_ = 0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,(pointer)__p);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &emitted);
  cmComputeComponentGraph::Compute
            ((this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl);
  bVar5 = CheckCircularDependencies(this);
  if (bVar5) {
    OrderLinkEntries(this);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    piVar3 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &this->FinalLinkEntries;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (piVar14 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish; piVar14 != piVar3; piVar14 = piVar14 + -1) {
      iVar1 = piVar14[-1];
      pLVar4 = (this->EntryList).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_01 = pLVar4[iVar1].Target;
      i = iVar1;
      if (((this_01 == (cmGeneratorTarget *)0x0) ||
          (TVar7 = cmGeneratorTarget::GetType(this_01), TVar7 != SHARED_LIBRARY)) ||
         (pVar16 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                   _M_insert_unique<int_const&>
                             ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                               *)&emitted,&i),
         ((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        push_back(this_00,pLVar4 + iVar1);
      }
    }
    piVar3 = (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar14 = (this->ObjectEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish; piVar14 != piVar3; piVar14 = piVar14 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)this_00,
                 (this->EntryList).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start + piVar14[-1]);
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
              ((this->FinalLinkEntries).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->FinalLinkEntries).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var9 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_68 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header;
LAB_003fabbd:
      if (p_Var9 != local_68) {
        __x = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start + (int)p_Var9[1]._M_color;
        __rhs._M_current =
             (this->FinalLinkEntries).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_70 = (this->FinalLinkEntries).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar12 = (long)local_70 - (long)__rhs._M_current;
          for (lVar15 = lVar12 / 0x60 >> 2; iVar8._M_current = __rhs._M_current, 0 < lVar15;
              lVar15 = lVar15 + -1) {
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__rhs._M_current);
            if (_Var6) goto LAB_003facc6;
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(__rhs._M_current + 1));
            iVar8._M_current = __rhs._M_current + 1;
            if (_Var6) goto LAB_003facc6;
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(__rhs._M_current + 2));
            iVar8._M_current = __rhs._M_current + 2;
            if (_Var6) goto LAB_003facc6;
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(__rhs._M_current + 3));
            iVar8._M_current = __rhs._M_current + 3;
            if (_Var6) goto LAB_003facc6;
            __rhs._M_current = __rhs._M_current + 4;
            lVar12 = lVar12 + -0x180;
          }
          lVar12 = lVar12 / 0x60;
          if (lVar12 == 1) {
LAB_003fad46:
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__rhs._M_current);
            iVar8._M_current = local_70;
            if (_Var6) {
              iVar8._M_current = __rhs._M_current;
            }
          }
          else if (lVar12 == 2) {
LAB_003faca7:
            _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)iVar8._M_current);
            if (!_Var6) {
              __rhs._M_current = iVar8._M_current + 1;
              goto LAB_003fad46;
            }
          }
          else {
            iVar8._M_current = local_70;
            if ((lVar12 == 3) &&
               (_Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__rhs._M_current),
               iVar8._M_current = __rhs._M_current, !_Var6)) {
              iVar8._M_current = __rhs._M_current + 1;
              goto LAB_003faca7;
            }
          }
LAB_003facc6:
          if (iVar8._M_current ==
              (this->FinalLinkEntries).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003fad61;
          std::__cxx11::string::assign((char *)iVar8._M_current);
          for (p_Var13 = p_Var9[1]._M_left; p_Var13 != p_Var9[1]._M_parent;
              p_Var13 = (_Base_ptr)((long)&p_Var13[-1]._M_right + 4)) {
            iVar8 = std::
                    vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ::insert(this_00,iVar8._M_current,
                             (this->EntryList).
                             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                             *(int *)((long)&p_Var13[-1]._M_right + 4));
          }
          __rhs = std::
                  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ::insert(this_00,iVar8._M_current,__x);
          std::__cxx11::string::assign((char *)__rhs._M_current);
        } while( true );
      }
    }
    if (this->DebugMode == true) {
      DisplayFinalEntries(this);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&emitted._M_t);
  }
  return &this->FinalLinkEntries;
LAB_003fad61:
  p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  goto LAB_003fabbd;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Place explicitly linked object files in the front.  The linker will
  // always use them anyway, and they may depend on symbols from libraries.
  // Append in reverse order since we reverse the final order below.
  for (int i : cmReverseRange(this->ObjectEntries)) {
    this->FinalLinkEntries.emplace_back(this->EntryList[i]);
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Expand group items
  if (!this->GroupItems.empty()) {
    for (const auto& group : this->GroupItems) {
      const LinkEntry& groupEntry = this->EntryList[group.first];
      auto it = this->FinalLinkEntries.begin();
      while (true) {
        it = std::find_if(it, this->FinalLinkEntries.end(),
                          [&groupEntry](const LinkEntry& entry) -> bool {
                            return groupEntry.Item == entry.Item;
                          });
        if (it == this->FinalLinkEntries.end()) {
          break;
        }
        it->Item.Value = "</LINK_GROUP>";
        for (auto i = group.second.rbegin(); i != group.second.rend(); ++i) {
          it = this->FinalLinkEntries.insert(it, this->EntryList[*i]);
        }
        it = this->FinalLinkEntries.insert(it, groupEntry);
        it->Item.Value = "<LINK_GROUP>";
      }
    }
  }

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}